

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetFwd.c
# Opt level: O2

Aig_Man_t * Saig_ManRetimeForward(Aig_Man_t *p,int nMaxIters,int fVerbose)

{
  int iVar1;
  abctime aVar2;
  Aig_Man_t *pAVar3;
  abctime aVar4;
  int iVar5;
  Aig_Man_t *p_00;
  uint uVar6;
  int nRegMoves;
  int local_3c;
  int local_38;
  int nRegFixed;
  
  nRegMoves = 1;
  uVar6 = 1;
  p_00 = p;
  local_3c = fVerbose;
  local_38 = nMaxIters;
  while( true ) {
    iVar5 = nRegMoves;
    aVar2 = Abc_Clock();
    iVar1 = local_3c;
    if ((local_38 <= (int)(uVar6 - 1)) || (iVar5 < 1)) break;
    pAVar3 = Saig_ManRetimeForwardOne(p_00,&nRegFixed,&nRegMoves);
    if (local_3c != 0) {
      iVar5 = 0x84874f;
      printf("%2d : And = %6d. Reg = %5d. Unret = %5d. Move = %6d. ",(ulong)uVar6,
             (ulong)(uint)(p_00->nObjs[6] + p_00->nObjs[5]),(ulong)(uint)p_00->nRegs,
             (ulong)(uint)nRegFixed,(ulong)(uint)nRegMoves);
      Abc_Print(iVar5,"%s =","Time");
      aVar4 = Abc_Clock();
      Abc_Print(iVar5,"%9.2f sec\n",(double)(aVar4 - aVar2) / 1000000.0);
    }
    if (p_00 != p) {
      Aig_ManStop(p_00);
    }
    uVar6 = uVar6 + 1;
    p_00 = pAVar3;
  }
  pAVar3 = Aig_ManReduceLaches(p_00,local_3c);
  iVar5 = (int)p_00;
  if (iVar1 != 0) {
    Abc_Print(iVar5,"%s =","Register sharing time");
    aVar4 = Abc_Clock();
    Abc_Print(iVar5,"%9.2f sec\n",(double)(aVar4 - aVar2) / 1000000.0);
  }
  return pAVar3;
}

Assistant:

Aig_Man_t * Saig_ManRetimeForward( Aig_Man_t * p, int nMaxIters, int fVerbose )
{
    Aig_Man_t * pNew, * pTemp;
    int i, nRegFixed, nRegMoves = 1;
    abctime clk;
    pNew = p;
    for ( i = 0; i < nMaxIters && nRegMoves > 0; i++ )
    {
        clk = Abc_Clock();
        pNew = Saig_ManRetimeForwardOne( pTemp = pNew, &nRegFixed, &nRegMoves );
        if ( fVerbose )
        {
            printf( "%2d : And = %6d. Reg = %5d. Unret = %5d. Move = %6d. ", 
                i + 1, Aig_ManNodeNum(pTemp), Aig_ManRegNum(pTemp), nRegFixed, nRegMoves );
            ABC_PRT( "Time", Abc_Clock() - clk );
        }
        if ( pTemp != p )
            Aig_ManStop( pTemp );
    }
    clk = Abc_Clock();
    pNew = Aig_ManReduceLaches( pNew, fVerbose );
    if ( fVerbose )
    {
        ABC_PRT( "Register sharing time", Abc_Clock() - clk );
    }
    return pNew;
}